

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O1

LBBox3fa * __thiscall
embree::avx::GridMeshISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,GridMeshISA *this,size_t buildID,BBox1f *time_range,
          SubGridBuildData *sgrids)

{
  float fVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  undefined1 (*pauVar8) [16];
  int iVar9;
  int iVar10;
  ushort uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined4 uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ushort uVar19;
  ulong uVar20;
  ulong uVar21;
  BufferView<embree::Vec3fa> *pBVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar52;
  float fVar53;
  undefined1 auVar50 [16];
  float fVar54;
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  
  uVar20 = (ulong)sgrids[buildID].sx & 0x7fff;
  uVar12 = (ulong)sgrids[buildID].sy & 0x7fff;
  lVar4 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
  lVar18 = (ulong)sgrids[buildID].primID * *(long *)&(this->super_GridMesh).field_0x68;
  fVar1 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
  fVar32 = (this->super_GridMesh).super_Geometry.time_range.lower;
  fVar31 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar32;
  fVar28 = (time_range->lower - fVar32) / fVar31;
  fVar31 = (time_range->upper - fVar32) / fVar31;
  fVar32 = fVar1 * fVar28;
  fVar33 = fVar1 * fVar31;
  auVar59 = vroundss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32),9);
  auVar56 = vroundss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33),10);
  auVar26 = vmaxss_avx(auVar59,ZEXT816(0));
  fVar34 = auVar26._0_4_;
  iVar6 = (int)fVar34;
  iVar9 = -1;
  if (-1 < (int)auVar59._0_4_) {
    iVar9 = (int)auVar59._0_4_;
  }
  iVar10 = (int)fVar1 + 1;
  if ((int)auVar56._0_4_ < (int)fVar1 + 1) {
    iVar10 = (int)auVar56._0_4_;
  }
  auVar26 = vminss_avx(auVar56,ZEXT416((uint)fVar1));
  uVar2 = *(ushort *)(lVar4 + 10 + lVar18);
  uVar21 = (ulong)uVar2;
  if (uVar12 + 3 < (ulong)uVar2) {
    uVar21 = uVar12 + 3;
  }
  auVar40._8_4_ = 0xff800000;
  auVar40._0_8_ = 0xff800000ff800000;
  auVar40._12_4_ = 0xff800000;
  auVar50._8_4_ = 0x7f800000;
  auVar50._0_8_ = 0x7f8000007f800000;
  auVar50._12_4_ = 0x7f800000;
  uVar11 = (ushort)uVar12;
  uVar19 = (ushort)uVar20;
  auVar59 = auVar50;
  auVar56 = auVar40;
  if (uVar11 < uVar2) {
    uVar3 = *(ushort *)(lVar4 + 8 + lVar18);
    uVar16 = (ulong)uVar3;
    if (uVar20 + 3 < (ulong)uVar3) {
      uVar16 = uVar20 + 3;
    }
    pBVar22 = (this->super_GridMesh).vertices.items + iVar6;
    auVar60 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    auVar57 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
    bVar23 = true;
    auVar61._8_4_ = 0xddccb9a2;
    auVar61._0_8_ = 0xddccb9a2ddccb9a2;
    auVar61._12_4_ = 0xddccb9a2;
    auVar63._8_4_ = 0x5dccb9a2;
    auVar63._0_8_ = 0x5dccb9a25dccb9a2;
    auVar63._12_4_ = 0x5dccb9a2;
    uVar13 = uVar12;
    do {
      if (uVar19 < uVar3) {
        sVar5 = (pBVar22->super_RawBufferView).stride;
        pauVar8 = (undefined1 (*) [16])
                  ((pBVar22->super_RawBufferView).ptr_ofs +
                  (*(uint *)(lVar4 + lVar18) + uVar20 + *(uint *)(lVar4 + 4 + lVar18) * uVar13) *
                  sVar5);
        lVar17 = uVar16 - uVar20;
        do {
          auVar56 = auVar57._0_16_;
          auVar59 = auVar60._0_16_;
          auVar64 = *pauVar8;
          auVar68 = vcmpps_avx(auVar64,auVar61,6);
          auVar67 = vcmpps_avx(auVar64,auVar63,1);
          auVar68 = vandps_avx(auVar67,auVar68);
          uVar15 = vmovmskps_avx(auVar68);
          if ((~(byte)uVar15 & 7) != 0) {
            if (bVar23) {
              auVar56._8_4_ = 0xff800000;
              auVar56._0_8_ = 0xff800000ff800000;
              auVar56._12_4_ = 0xff800000;
              auVar59._8_4_ = 0x7f800000;
              auVar59._0_8_ = 0x7f8000007f800000;
              auVar59._12_4_ = 0x7f800000;
            }
            goto LAB_01328d8b;
          }
          auVar59 = vminps_avx(auVar59,auVar64);
          auVar60 = ZEXT1664(auVar59);
          auVar59 = vmaxps_avx(auVar56,auVar64);
          auVar57 = ZEXT1664(auVar59);
          pauVar8 = (undefined1 (*) [16])(*pauVar8 + sVar5);
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
      }
      auVar56 = auVar57._0_16_;
      auVar59 = auVar60._0_16_;
      uVar13 = uVar13 + 1;
      bVar23 = uVar13 < uVar21;
    } while (uVar13 != uVar21);
  }
LAB_01328d8b:
  fVar35 = auVar26._0_4_;
  iVar7 = (int)fVar35;
  if (uVar11 < uVar2) {
    uVar3 = *(ushort *)(lVar4 + 8 + lVar18);
    uVar16 = (ulong)uVar3;
    if (uVar20 + 3 < (ulong)uVar3) {
      uVar16 = uVar20 + 3;
    }
    pBVar22 = (this->super_GridMesh).vertices.items + iVar7;
    auVar60 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    auVar57 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
    bVar23 = true;
    auVar26._8_4_ = 0xddccb9a2;
    auVar26._0_8_ = 0xddccb9a2ddccb9a2;
    auVar26._12_4_ = 0xddccb9a2;
    auVar64._8_4_ = 0x5dccb9a2;
    auVar64._0_8_ = 0x5dccb9a25dccb9a2;
    auVar64._12_4_ = 0x5dccb9a2;
    uVar13 = uVar12;
    do {
      if (uVar19 < uVar3) {
        sVar5 = (pBVar22->super_RawBufferView).stride;
        pauVar8 = (undefined1 (*) [16])
                  ((pBVar22->super_RawBufferView).ptr_ofs +
                  (*(uint *)(lVar4 + lVar18) + uVar20 + *(uint *)(lVar4 + 4 + lVar18) * uVar13) *
                  sVar5);
        lVar17 = uVar16 - uVar20;
        do {
          auVar40 = auVar57._0_16_;
          auVar50 = auVar60._0_16_;
          auVar61 = *pauVar8;
          auVar63 = vcmpps_avx(auVar61,auVar26,6);
          auVar68 = vcmpps_avx(auVar61,auVar64,1);
          auVar63 = vandps_avx(auVar68,auVar63);
          uVar15 = vmovmskps_avx(auVar63);
          if ((~(byte)uVar15 & 7) != 0) {
            if (bVar23) {
              auVar40._8_4_ = 0xff800000;
              auVar40._0_8_ = 0xff800000ff800000;
              auVar40._12_4_ = 0xff800000;
              auVar50._8_4_ = 0x7f800000;
              auVar50._0_8_ = 0x7f8000007f800000;
              auVar50._12_4_ = 0x7f800000;
            }
            goto LAB_01328e5d;
          }
          auVar50 = vminps_avx(auVar50,auVar61);
          auVar60 = ZEXT1664(auVar50);
          auVar40 = vmaxps_avx(auVar40,auVar61);
          auVar57 = ZEXT1664(auVar40);
          pauVar8 = (undefined1 (*) [16])(*pauVar8 + sVar5);
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
      }
      auVar40 = auVar57._0_16_;
      auVar50 = auVar60._0_16_;
      uVar13 = uVar13 + 1;
      bVar23 = uVar13 < uVar21;
    } while (uVar13 != uVar21);
  }
LAB_01328e5d:
  fVar49 = auVar50._0_4_;
  fVar52 = auVar50._4_4_;
  fVar53 = auVar50._8_4_;
  fVar54 = auVar50._12_4_;
  fVar41 = auVar59._0_4_;
  fVar42 = auVar59._4_4_;
  fVar43 = auVar59._8_4_;
  fVar44 = auVar59._12_4_;
  fVar45 = auVar56._0_4_;
  fVar46 = auVar56._4_4_;
  fVar47 = auVar56._8_4_;
  fVar48 = auVar56._12_4_;
  fVar37 = auVar40._4_4_;
  fVar38 = auVar40._8_4_;
  fVar39 = auVar40._12_4_;
  fVar36 = auVar40._0_4_;
  if (iVar10 - iVar9 == 1) {
    auVar26 = vmaxss_avx(ZEXT416((uint)(fVar32 - fVar34)),ZEXT816(0) << 0x40);
    auVar59 = vshufps_avx(auVar26,auVar26,0);
    auVar26 = ZEXT416((uint)(1.0 - auVar26._0_4_));
    auVar26 = vshufps_avx(auVar26,auVar26,0);
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] =
         fVar41 * auVar26._0_4_ + fVar49 * auVar59._0_4_;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] =
         fVar42 * auVar26._4_4_ + fVar52 * auVar59._4_4_;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] =
         fVar43 * auVar26._8_4_ + fVar53 * auVar59._8_4_;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] =
         fVar44 * auVar26._12_4_ + fVar54 * auVar59._12_4_;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] =
         fVar45 * auVar26._0_4_ + auVar59._0_4_ * fVar36;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] =
         fVar46 * auVar26._4_4_ + auVar59._4_4_ * fVar37;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] =
         fVar47 * auVar26._8_4_ + auVar59._8_4_ * fVar38;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] =
         fVar48 * auVar26._12_4_ + auVar59._12_4_ * fVar39;
    auVar26 = vmaxss_avx(ZEXT416((uint)(fVar35 - fVar33)),ZEXT816(0) << 0x40);
    auVar59 = vshufps_avx(auVar26,auVar26,0);
    auVar26 = ZEXT416((uint)(1.0 - auVar26._0_4_));
    auVar26 = vshufps_avx(auVar26,auVar26,0);
    fVar32 = fVar41 * auVar59._0_4_ + fVar49 * auVar26._0_4_;
    fVar33 = fVar42 * auVar59._4_4_ + fVar52 * auVar26._4_4_;
    fVar34 = fVar43 * auVar59._8_4_ + fVar53 * auVar26._8_4_;
    fVar35 = fVar44 * auVar59._12_4_ + fVar54 * auVar26._12_4_;
    fVar36 = fVar45 * auVar59._0_4_ + auVar26._0_4_ * fVar36;
    fVar37 = fVar46 * auVar59._4_4_ + auVar26._4_4_ * fVar37;
    fVar38 = fVar47 * auVar59._8_4_ + auVar26._8_4_ * fVar38;
    fVar39 = fVar48 * auVar59._12_4_ + auVar26._12_4_ * fVar39;
  }
  else {
    auVar62._8_4_ = 0xff800000;
    auVar62._0_8_ = 0xff800000ff800000;
    auVar62._12_4_ = 0xff800000;
    auVar65._8_4_ = 0x7f800000;
    auVar65._0_8_ = 0x7f8000007f800000;
    auVar65._12_4_ = 0x7f800000;
    auVar68 = auVar65;
    auVar67 = auVar62;
    if (uVar11 < uVar2) {
      uVar3 = *(ushort *)(lVar4 + 8 + lVar18);
      uVar16 = (ulong)uVar3;
      if (uVar20 + 3 < (ulong)uVar3) {
        uVar16 = uVar20 + 3;
      }
      pBVar22 = (this->super_GridMesh).vertices.items;
      auVar60 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar57 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      bVar23 = true;
      auVar69._8_4_ = 0xddccb9a2;
      auVar69._0_8_ = 0xddccb9a2ddccb9a2;
      auVar69._12_4_ = 0xddccb9a2;
      auVar29._8_4_ = 0x5dccb9a2;
      auVar29._0_8_ = 0x5dccb9a25dccb9a2;
      auVar29._12_4_ = 0x5dccb9a2;
      uVar13 = uVar12;
      do {
        if (uVar19 < uVar3) {
          sVar5 = pBVar22[(long)iVar6 + 1].super_RawBufferView.stride;
          pauVar8 = (undefined1 (*) [16])
                    (pBVar22[(long)iVar6 + 1].super_RawBufferView.ptr_ofs +
                    (*(uint *)(lVar4 + lVar18) + uVar20 + *(uint *)(lVar4 + 4 + lVar18) * uVar13) *
                    sVar5);
          lVar17 = uVar16 - uVar20;
          do {
            auVar67 = auVar57._0_16_;
            auVar68 = auVar60._0_16_;
            auVar26 = *pauVar8;
            auVar59 = vcmpps_avx(auVar26,auVar69,6);
            auVar56 = vcmpps_avx(auVar26,auVar29,1);
            auVar59 = vandps_avx(auVar59,auVar56);
            uVar15 = vmovmskps_avx(auVar59);
            if ((~(byte)uVar15 & 7) != 0) {
              if (bVar23) {
                auVar67._8_4_ = 0xff800000;
                auVar67._0_8_ = 0xff800000ff800000;
                auVar67._12_4_ = 0xff800000;
                auVar68._8_4_ = 0x7f800000;
                auVar68._0_8_ = 0x7f8000007f800000;
                auVar68._12_4_ = 0x7f800000;
              }
              goto LAB_01328fd8;
            }
            auVar59 = vminps_avx(auVar68,auVar26);
            auVar60 = ZEXT1664(auVar59);
            auVar26 = vmaxps_avx(auVar67,auVar26);
            auVar57 = ZEXT1664(auVar26);
            pauVar8 = (undefined1 (*) [16])(*pauVar8 + sVar5);
            lVar17 = lVar17 + -1;
          } while (lVar17 != 0);
        }
        auVar67 = auVar57._0_16_;
        auVar68 = auVar60._0_16_;
        uVar13 = uVar13 + 1;
        bVar23 = uVar13 < uVar21;
      } while (uVar13 != uVar21);
    }
LAB_01328fd8:
    if (uVar11 < uVar2) {
      uVar3 = *(ushort *)(lVar4 + 8 + lVar18);
      uVar16 = (ulong)uVar3;
      if (uVar20 + 3 < (ulong)uVar3) {
        uVar16 = uVar20 + 3;
      }
      pBVar22 = (this->super_GridMesh).vertices.items;
      auVar60 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar57 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      bVar23 = true;
      auVar70._8_4_ = 0xddccb9a2;
      auVar70._0_8_ = 0xddccb9a2ddccb9a2;
      auVar70._12_4_ = 0xddccb9a2;
      auVar30._8_4_ = 0x5dccb9a2;
      auVar30._0_8_ = 0x5dccb9a25dccb9a2;
      auVar30._12_4_ = 0x5dccb9a2;
      uVar13 = uVar12;
      do {
        if (uVar19 < uVar3) {
          sVar5 = pBVar22[(long)iVar7 + -1].super_RawBufferView.stride;
          pauVar8 = (undefined1 (*) [16])
                    (pBVar22[(long)iVar7 + -1].super_RawBufferView.ptr_ofs +
                    (*(uint *)(lVar4 + lVar18) + uVar20 + *(uint *)(lVar4 + 4 + lVar18) * uVar13) *
                    sVar5);
          lVar17 = uVar16 - uVar20;
          do {
            auVar62 = auVar57._0_16_;
            auVar65 = auVar60._0_16_;
            auVar26 = *pauVar8;
            auVar59 = vcmpps_avx(auVar26,auVar70,6);
            auVar56 = vcmpps_avx(auVar26,auVar30,1);
            auVar59 = vandps_avx(auVar59,auVar56);
            uVar15 = vmovmskps_avx(auVar59);
            if ((~(byte)uVar15 & 7) != 0) {
              if (bVar23) {
                auVar62._8_4_ = 0xff800000;
                auVar62._0_8_ = 0xff800000ff800000;
                auVar62._12_4_ = 0xff800000;
                auVar65._8_4_ = 0x7f800000;
                auVar65._0_8_ = 0x7f8000007f800000;
                auVar65._12_4_ = 0x7f800000;
              }
              goto LAB_013290a1;
            }
            auVar59 = vminps_avx(auVar65,auVar26);
            auVar60 = ZEXT1664(auVar59);
            auVar26 = vmaxps_avx(auVar62,auVar26);
            auVar57 = ZEXT1664(auVar26);
            pauVar8 = (undefined1 (*) [16])(*pauVar8 + sVar5);
            lVar17 = lVar17 + -1;
          } while (lVar17 != 0);
        }
        auVar62 = auVar57._0_16_;
        auVar65 = auVar60._0_16_;
        uVar13 = uVar13 + 1;
        bVar23 = uVar13 < uVar21;
      } while (uVar13 != uVar21);
    }
LAB_013290a1:
    auVar26 = vmaxss_avx(ZEXT416((uint)(fVar32 - fVar34)),ZEXT816(0) << 0x40);
    auVar59 = vshufps_avx(auVar26,auVar26,0);
    auVar26 = ZEXT416((uint)(1.0 - auVar26._0_4_));
    auVar26 = vshufps_avx(auVar26,auVar26,0);
    fVar41 = fVar41 * auVar26._0_4_ + auVar68._0_4_ * auVar59._0_4_;
    fVar42 = fVar42 * auVar26._4_4_ + auVar68._4_4_ * auVar59._4_4_;
    fVar43 = fVar43 * auVar26._8_4_ + auVar68._8_4_ * auVar59._8_4_;
    fVar44 = fVar44 * auVar26._12_4_ + auVar68._12_4_ * auVar59._12_4_;
    fVar45 = fVar45 * auVar26._0_4_ + auVar67._0_4_ * auVar59._0_4_;
    fVar46 = fVar46 * auVar26._4_4_ + auVar67._4_4_ * auVar59._4_4_;
    fVar47 = fVar47 * auVar26._8_4_ + auVar67._8_4_ * auVar59._8_4_;
    fVar48 = fVar48 * auVar26._12_4_ + auVar67._12_4_ * auVar59._12_4_;
    auVar26 = vmaxss_avx(ZEXT416((uint)(fVar35 - fVar33)),ZEXT816(0) << 0x40);
    auVar59 = vshufps_avx(auVar26,auVar26,0);
    auVar26 = ZEXT416((uint)(1.0 - auVar26._0_4_));
    auVar26 = vshufps_avx(auVar26,auVar26,0);
    fVar32 = fVar49 * auVar26._0_4_ + auVar65._0_4_ * auVar59._0_4_;
    fVar33 = fVar52 * auVar26._4_4_ + auVar65._4_4_ * auVar59._4_4_;
    fVar34 = fVar53 * auVar26._8_4_ + auVar65._8_4_ * auVar59._8_4_;
    fVar35 = fVar54 * auVar26._12_4_ + auVar65._12_4_ * auVar59._12_4_;
    fVar36 = auVar26._0_4_ * fVar36 + auVar62._0_4_ * auVar59._0_4_;
    fVar37 = auVar26._4_4_ * fVar37 + auVar62._4_4_ * auVar59._4_4_;
    fVar38 = auVar26._8_4_ * fVar38 + auVar62._8_4_ * auVar59._8_4_;
    fVar39 = auVar26._12_4_ * fVar39 + auVar62._12_4_ * auVar59._12_4_;
    if ((int)(iVar9 + 1U) < iVar10) {
      uVar16 = (ulong)(iVar9 + 1U);
      auVar27._8_4_ = 0x7f800000;
      auVar27._0_8_ = 0x7f8000007f800000;
      auVar27._12_4_ = 0x7f800000;
      auVar51._8_4_ = 0xff800000;
      auVar51._0_8_ = 0xff800000ff800000;
      auVar51._12_4_ = 0xff800000;
      auVar55._8_4_ = 0xddccb9a2;
      auVar55._0_8_ = 0xddccb9a2ddccb9a2;
      auVar55._12_4_ = 0xddccb9a2;
      auVar58._8_4_ = 0x5dccb9a2;
      auVar58._0_8_ = 0x5dccb9a25dccb9a2;
      auVar58._12_4_ = 0x5dccb9a2;
      do {
        auVar26 = auVar27;
        auVar59 = auVar51;
        if (uVar11 < uVar2) {
          uVar3 = *(ushort *)(lVar4 + 8 + lVar18);
          uVar13 = (ulong)uVar3;
          if (uVar20 + 3 < (ulong)uVar3) {
            uVar13 = uVar20 + 3;
          }
          pBVar22 = (this->super_GridMesh).vertices.items + uVar16;
          bVar23 = true;
          auVar57 = ZEXT1664(auVar51);
          auVar60 = ZEXT1664(auVar27);
          uVar14 = uVar12;
          do {
            if (uVar19 < uVar3) {
              sVar5 = (pBVar22->super_RawBufferView).stride;
              pauVar8 = (undefined1 (*) [16])
                        ((pBVar22->super_RawBufferView).ptr_ofs +
                        (*(uint *)(lVar4 + lVar18) + uVar20 + *(uint *)(lVar4 + 4 + lVar18) * uVar14
                        ) * sVar5);
              lVar17 = uVar13 - uVar20;
              do {
                auVar26 = *pauVar8;
                auVar59 = vcmpps_avx(auVar26,auVar55,6);
                auVar56 = vcmpps_avx(auVar26,auVar58,1);
                auVar59 = vandps_avx(auVar59,auVar56);
                uVar15 = vmovmskps_avx(auVar59);
                if ((~(byte)uVar15 & 7) != 0) {
                  auVar26 = auVar27;
                  auVar59 = auVar51;
                  if (!bVar23) {
                    auVar26 = auVar60._0_16_;
                    auVar59 = auVar57._0_16_;
                  }
                  goto LAB_0132922e;
                }
                auVar59 = vminps_avx(auVar60._0_16_,auVar26);
                auVar60 = ZEXT1664(auVar59);
                auVar26 = vmaxps_avx(auVar57._0_16_,auVar26);
                auVar57 = ZEXT1664(auVar26);
                pauVar8 = (undefined1 (*) [16])(*pauVar8 + sVar5);
                lVar17 = lVar17 + -1;
              } while (lVar17 != 0);
            }
            uVar14 = uVar14 + 1;
            bVar23 = uVar14 < uVar21;
            auVar26 = auVar60._0_16_;
            auVar59 = auVar57._0_16_;
          } while (uVar14 != uVar21);
        }
LAB_0132922e:
        auVar24._0_4_ = ((float)(int)uVar16 / fVar1 - fVar28) / (fVar31 - fVar28);
        auVar24._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar56 = vshufps_avx(auVar24,auVar24,0);
        auVar40 = vshufps_avx(ZEXT416((uint)(1.0 - auVar24._0_4_)),
                              ZEXT416((uint)(1.0 - auVar24._0_4_)),0);
        auVar66._0_4_ = fVar32 * auVar56._0_4_ + auVar40._0_4_ * fVar41;
        auVar66._4_4_ = fVar33 * auVar56._4_4_ + auVar40._4_4_ * fVar42;
        auVar66._8_4_ = fVar34 * auVar56._8_4_ + auVar40._8_4_ * fVar43;
        auVar66._12_4_ = fVar35 * auVar56._12_4_ + auVar40._12_4_ * fVar44;
        auVar26 = vsubps_avx(auVar26,auVar66);
        auVar25._0_4_ = auVar40._0_4_ * fVar45 + fVar36 * auVar56._0_4_;
        auVar25._4_4_ = auVar40._4_4_ * fVar46 + fVar37 * auVar56._4_4_;
        auVar25._8_4_ = auVar40._8_4_ * fVar47 + fVar38 * auVar56._8_4_;
        auVar25._12_4_ = auVar40._12_4_ * fVar48 + fVar39 * auVar56._12_4_;
        auVar56 = vsubps_avx(auVar59,auVar25);
        auVar59 = vminps_avx(auVar26,ZEXT816(0) << 0x40);
        auVar26 = vmaxps_avx(auVar56,ZEXT816(0) << 0x40);
        fVar41 = fVar41 + auVar59._0_4_;
        fVar42 = fVar42 + auVar59._4_4_;
        fVar43 = fVar43 + auVar59._8_4_;
        fVar44 = fVar44 + auVar59._12_4_;
        fVar32 = fVar32 + auVar59._0_4_;
        fVar33 = fVar33 + auVar59._4_4_;
        fVar34 = fVar34 + auVar59._8_4_;
        fVar35 = fVar35 + auVar59._12_4_;
        fVar45 = fVar45 + auVar26._0_4_;
        fVar46 = fVar46 + auVar26._4_4_;
        fVar47 = fVar47 + auVar26._8_4_;
        fVar48 = fVar48 + auVar26._12_4_;
        fVar36 = fVar36 + auVar26._0_4_;
        fVar37 = fVar37 + auVar26._4_4_;
        fVar38 = fVar38 + auVar26._8_4_;
        fVar39 = fVar39 + auVar26._12_4_;
        uVar16 = uVar16 + 1;
      } while (iVar10 != (int)uVar16);
    }
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] = fVar41;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] = fVar42;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] = fVar43;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] = fVar44;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar45;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar46;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar47;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar48;
  }
  (__return_storage_ptr__->bounds1).lower.field_0.m128[0] = fVar32;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[1] = fVar33;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[2] = fVar34;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[3] = fVar35;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[0] = fVar36;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[1] = fVar37;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[2] = fVar38;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[3] = fVar39;
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(size_t buildID, const BBox1f& time_range, const SubGridBuildData * const sgrids) const override {
        const SubGridBuildData &subgrid = sgrids[buildID];                      
        const unsigned int primID = subgrid.primID;
        const size_t x = subgrid.x();
        const size_t y = subgrid.y();
        return linearBounds(grid(primID),x,y,time_range);
      }